

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

bool __thiscall cmCTestGIT::UpdateByFetchAndReset(cmCTestGIT *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  uint uVar5;
  ulong uVar6;
  char **cmd;
  char *pcVar7;
  ostream *poVar8;
  long lVar9;
  bool local_541;
  undefined1 local_4e8 [8];
  OutputLogger reset_err;
  OutputLogger reset_out;
  char *git_reset [5];
  size_type pos;
  string line;
  ifstream fin;
  string local_210;
  undefined1 local_1f0 [8];
  string fetch_head;
  string sha1;
  undefined1 local_1a8 [8];
  OutputLogger fetch_err;
  OutputLogger fetch_out;
  value_type local_120;
  reference local_118;
  string *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string local_d8;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  string opts;
  undefined1 local_38 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> git_fetch;
  char *git;
  cmCTestGIT *this_local;
  
  git_fetch.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)std::__cxx11::string::c_str();
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,
             (value_type *)
             &git_fetch.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  opts.field_2._8_8_ = anon_var_dwarf_25a824;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,
             (value_type *)((long)&opts.field_2 + 8));
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"UpdateOptions",&local_91);
  cmCTest::GetCTestConfiguration((string *)local_70,pcVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"GITUpdateOptions",
               (allocator<char> *)
               ((long)&args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmCTest::GetCTestConfiguration(&local_b8,pcVar1,&local_d8);
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  cmSystemTools::ParseArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,(string *)local_70);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  arg = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&arg), bVar2) {
    local_118 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    local_120 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,&local_120);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  fetch_out.super_LineParser.Separator = '\0';
  fetch_out.super_LineParser.LineEnd = '\0';
  fetch_out.super_LineParser.IgnoreCR = false;
  fetch_out.super_LineParser._59_5_ = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38,
             (value_type *)&fetch_out.super_LineParser.Separator);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&fetch_err.super_LineParser.Separator,
             (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"fetch-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_1a8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "fetch-err> ");
  cmd = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  bVar2 = cmCTestVC::RunUpdateCommand
                    ((cmCTestVC *)this,cmd,(OutputParser *)&fetch_err.super_LineParser.Separator,
                     (OutputParser *)local_1a8,Auto);
  if (bVar2) {
    std::__cxx11::string::string((string *)(fetch_head.field_2._M_local_buf + 8));
    FindGitDir_abi_cxx11_(&local_210,this);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                   &local_210,"/FETCH_HEAD");
    std::__cxx11::string::~string((string *)&local_210);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    _Var4 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream((void *)((long)&line.field_2 + 8),pcVar7,_Var4);
    bVar3 = std::ios::operator!((ios *)((long)&line.field_2 +
                                       *(long *)(line.field_2._8_8_ + -0x18) + 8));
    if ((bVar3 & 1) == 0) {
      std::__cxx11::string::string((string *)&pos);
      while( true ) {
        uVar5 = std::__cxx11::string::empty();
        local_541 = false;
        if ((uVar5 & 1) != 0) {
          local_541 = cmsys::SystemTools::GetLineFromStream
                                ((istream *)(line.field_2._M_local_buf + 8),(string *)&pos,
                                 (bool *)0x0,0xffffffffffffffff);
        }
        if (local_541 == false) break;
        poVar8 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"FETCH_HEAD> ");
        poVar8 = std::operator<<(poVar8,(string *)&pos);
        std::operator<<(poVar8,"\n");
        lVar9 = std::__cxx11::string::find((char *)&pos,0xd1ba26);
        if ((lVar9 == -1) && (lVar9 = std::__cxx11::string::find((char)&pos,9), lVar9 != -1)) {
          std::__cxx11::string::operator=
                    ((string *)(fetch_head.field_2._M_local_buf + 8),(string *)&pos);
          std::__cxx11::string::resize((ulong)(fetch_head.field_2._M_local_buf + 8));
        }
      }
      uVar6 = std::__cxx11::string::empty();
      bVar2 = (uVar6 & 1) != 0;
      if (bVar2) {
        std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                        "FETCH_HEAD has no upstream branch candidate!\n");
        this_local._7_1_ = 0;
      }
      std::__cxx11::string::~string((string *)&pos);
    }
    else {
      poVar8 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Unable to open ");
      poVar8 = std::operator<<(poVar8,(string *)local_1f0);
      std::operator<<(poVar8,"\n");
      this_local._7_1_ = 0;
      bVar2 = true;
    }
    std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
    std::__cxx11::string::~string((string *)local_1f0);
    if (!bVar2) {
      reset_out.super_LineParser._56_8_ =
           git_fetch.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::c_str();
      cmProcessTools::OutputLogger::OutputLogger
                ((OutputLogger *)&reset_err.super_LineParser.Separator,
                 (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"reset-out> ");
      cmProcessTools::OutputLogger::OutputLogger
                ((OutputLogger *)local_4e8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                 "reset-err> ");
      this_local._7_1_ =
           cmCTestVC::RunChild((cmCTestVC *)this,(char **)&reset_out.super_LineParser.Separator,
                               (OutputParser *)&reset_err.super_LineParser.Separator,
                               (OutputParser *)local_4e8,(char *)0x0,Auto);
      cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_4e8);
      cmProcessTools::OutputLogger::~OutputLogger
                ((OutputLogger *)&reset_err.super_LineParser.Separator);
    }
    std::__cxx11::string::~string((string *)(fetch_head.field_2._M_local_buf + 8));
  }
  else {
    this_local._7_1_ = 0;
  }
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_1a8);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)&fetch_err.super_LineParser.Separator)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::__cxx11::string::~string((string *)local_70);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_38);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestGIT::UpdateByFetchAndReset()
{
  const char* git = this->CommandLineTool.c_str();

  // Use "git fetch" to get remote commits.
  std::vector<char const*> git_fetch;
  git_fetch.push_back(git);
  git_fetch.push_back("fetch");

  // Add user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("GITUpdateOptions");
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);
  for (std::string const& arg : args) {
    git_fetch.push_back(arg.c_str());
  }

  // Sentinel argument.
  git_fetch.push_back(nullptr);

  // Fetch upstream refs.
  OutputLogger fetch_out(this->Log, "fetch-out> ");
  OutputLogger fetch_err(this->Log, "fetch-err> ");
  if (!this->RunUpdateCommand(git_fetch.data(), &fetch_out, &fetch_err)) {
    return false;
  }

  // Identify the merge head that would be used by "git pull".
  std::string sha1;
  {
    std::string fetch_head = this->FindGitDir() + "/FETCH_HEAD";
    cmsys::ifstream fin(fetch_head.c_str(), std::ios::in | std::ios::binary);
    if (!fin) {
      this->Log << "Unable to open " << fetch_head << "\n";
      return false;
    }
    std::string line;
    while (sha1.empty() && cmSystemTools::GetLineFromStream(fin, line)) {
      this->Log << "FETCH_HEAD> " << line << "\n";
      if (line.find("\tnot-for-merge\t") == std::string::npos) {
        std::string::size_type pos = line.find('\t');
        if (pos != std::string::npos) {
          sha1 = std::move(line);
          sha1.resize(pos);
        }
      }
    }
    if (sha1.empty()) {
      this->Log << "FETCH_HEAD has no upstream branch candidate!\n";
      return false;
    }
  }

  // Reset the local branch to point at that tracked from upstream.
  char const* git_reset[] = { git, "reset", "--hard", sha1.c_str(), nullptr };
  OutputLogger reset_out(this->Log, "reset-out> ");
  OutputLogger reset_err(this->Log, "reset-err> ");
  return this->RunChild(&git_reset[0], &reset_out, &reset_err);
}